

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O3

void writefiles(char *path,char *s,uchar (*result) [512] [512],float sigma,int pic_t,int pic_x,
               int pic_y,int start,int end,uchar *header)

{
  FILE *__s;
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  uchar (*__ptr) [512];
  uint uVar4;
  ulong uVar5;
  char fname [100];
  char local_98 [104];
  
  if ((sigma != 0.0) || (NAN(sigma))) {
    puts("\nWriting smoothed files...");
    uVar4 = end - start;
    if (start <= end) {
      uVar5 = 0xffffffffffffffff;
      do {
        sprintf(local_98,"%s/smoothed.%s%d-%3.1f",(double)sigma,path,s,(ulong)(uint)start);
        __s = fopen(local_98,"wb");
        if (__s == (FILE *)0x0) {
          printf("File %s cannot be written\n",local_98);
          exit(1);
        }
        sVar1 = fwrite(header,1,0x20,__s);
        uVar3 = (ulong)(uint)pic_x;
        __ptr = *result;
        if (0 < pic_x) {
          do {
            sVar2 = fwrite(__ptr,1,(long)pic_y,__s);
            sVar1 = (long)(int)sVar1 + sVar2;
            uVar3 = uVar3 - 1;
            __ptr = __ptr + 1;
          } while (uVar3 != 0);
        }
        uVar5 = uVar5 + 1;
        printf("File %s written (%d bytes)\n",local_98,sVar1 & 0xffffffff);
        fflush(_stdout);
        fclose(__s);
        start = start + 1;
        result = (uchar (*) [512] [512])((long)result + 0x40000);
      } while (uVar5 != uVar4);
    }
  }
  return;
}

Assistant:

void writefiles(char path[], char s[],
unsigned char result[FIVE][PIC_X][PIC_Y],
float sigma,
int pic_t, int pic_x, int pic_y, int start, int end,
unsigned char header[HEAD])
{
char fname[100];
int i,j,time,no_bytes;
FILE *fd;

if(sigma==0.0) return;
printf("\nWriting smoothed files...\n");

time = -1;
for (i=start;i<=end;i++)
	{
	no_bytes = 0;
	time++;
	sprintf(fname,"%s/smoothed.%s%d-%3.1f",path,s,i,sigma);
 	if((fd=fopen(fname,"wb"))!=NULL)
		{
		no_bytes += fwrite(&header[0], sizeof(unsigned char), HEAD, fd); /* Write 32 byte raster header */
		for(j=0;j<pic_x;j++)
			no_bytes += fwrite(&result[time][j][0],sizeof(unsigned char), pic_y, fd);
		printf("File %s written (%d bytes)\n",fname,no_bytes);
		}
	else
		{
		printf("File %s cannot be written\n",fname);
		exit(1);
		}
	fflush(stdout);
	fclose(fd);
	}
}